

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O0

void __thiscall o3dgc::Vector<long>::Allocate(Vector<long> *this,unsigned_long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long *__dest;
  long *tmp;
  unsigned_long size_local;
  Vector<long> *this_local;
  
  if (this->m_allocated < size) {
    this->m_allocated = size;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_allocated;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    __dest = (long *)operator_new__(uVar2);
    if (this->m_size != 0) {
      memcpy(__dest,this->m_buffer,this->m_size << 3);
      if (this->m_buffer != (long *)0x0) {
        operator_delete__(this->m_buffer);
      }
    }
    this->m_buffer = __dest;
  }
  return;
}

Assistant:

void                    Allocate(unsigned long size)
                                {
                                    if (size > m_allocated)
                                    {
                                        m_allocated = size;
                                        T * tmp     = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                }